

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

int yaml_parser_fetch_anchor(yaml_parser_t *parser,yaml_token_type_t type)

{
  size_t *psVar1;
  yaml_token_t **tail;
  byte bVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  byte *pbVar8;
  ulong uVar9;
  char *pcVar10;
  uint uVar11;
  long lVar12;
  yaml_token_t *pyVar13;
  yaml_token_t *pyVar14;
  byte bVar15;
  yaml_mark_t start_mark;
  byte *local_d8;
  byte *pbStack_d0;
  byte *local_c8 [2];
  yaml_mark_t *local_b8;
  yaml_token_type_t local_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  size_t local_98;
  yaml_token_t local_88;
  
  bVar15 = 0;
  iVar4 = yaml_parser_save_simple_key(parser);
  if (iVar4 != 0) {
    parser->simple_key_allowed = 0;
    local_d8 = (byte *)0x0;
    pbStack_d0 = (byte *)0x0;
    local_c8[0] = (byte *)0x0;
    local_d8 = (byte *)yaml_malloc(0x10);
    if (local_d8 == (byte *)0x0) {
LAB_00111dc5:
      parser->error = YAML_MEMORY_ERROR;
    }
    else {
      pbStack_d0 = local_d8 + 0x10;
      local_d8[0] = 0;
      local_d8[1] = 0;
      local_d8[2] = 0;
      local_d8[3] = 0;
      local_d8[4] = 0;
      local_d8[5] = 0;
      local_d8[6] = 0;
      local_d8[7] = 0;
      local_d8[8] = 0;
      local_d8[9] = 0;
      local_d8[10] = 0;
      local_d8[0xb] = 0;
      local_d8[0xc] = 0;
      local_d8[0xd] = 0;
      local_d8[0xe] = 0;
      local_d8[0xf] = 0;
      local_98 = (parser->mark).column;
      local_a8 = (undefined4)(parser->mark).index;
      uStack_a4 = *(undefined4 *)((long)&(parser->mark).index + 4);
      uStack_a0 = (undefined4)(parser->mark).line;
      uStack_9c = *(undefined4 *)((long)&(parser->mark).line + 4);
      (parser->mark).index = (parser->mark).index + 1;
      psVar1 = &(parser->mark).column;
      *psVar1 = *psVar1 + 1;
      pbVar8 = (parser->buffer).pointer;
      sVar7 = parser->unread - 1;
      parser->unread = sVar7;
      bVar2 = *pbVar8;
      lVar12 = 1;
      if ((((char)bVar2 < '\0') && (lVar12 = 2, (bVar2 & 0xe0) != 0xc0)) &&
         (lVar12 = 3, (bVar2 & 0xf0) != 0xe0)) {
        lVar12 = (ulong)((bVar2 & 0xf8) == 0xf0) << 2;
      }
      (parser->buffer).pointer = pbVar8 + lVar12;
      local_c8[0] = local_d8;
      local_ac = type;
      if ((sVar7 != 0) || (iVar4 = yaml_parser_update_buffer(parser,1), iVar4 != 0)) {
        local_b8 = &parser->mark;
        iVar4 = 0;
        while( true ) {
          pbVar8 = (parser->buffer).pointer;
          bVar2 = *pbVar8;
          if (((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) &&
             ((bVar2 != 0x5f && (bVar2 != 0x2d)))) break;
          if ((pbStack_d0 <= local_c8[0] + 5) &&
             (iVar5 = yaml_string_extend(&local_d8,local_c8,&pbStack_d0), iVar5 == 0))
          goto LAB_00111dc5;
          pbVar8 = (parser->buffer).pointer;
          bVar2 = *pbVar8;
          if ((char)bVar2 < '\0') {
            if ((bVar2 & 0xe0) == 0xc0) {
LAB_00111d54:
              (parser->buffer).pointer = pbVar8 + 1;
              *local_c8[0] = *pbVar8;
              pbVar8 = (parser->buffer).pointer;
              local_c8[0] = local_c8[0] + 1;
              goto LAB_00111d78;
            }
            if ((bVar2 & 0xf0) == 0xe0) {
LAB_00111d30:
              (parser->buffer).pointer = pbVar8 + 1;
              *local_c8[0] = *pbVar8;
              pbVar8 = (parser->buffer).pointer;
              local_c8[0] = local_c8[0] + 1;
              goto LAB_00111d54;
            }
            if ((bVar2 & 0xf8) == 0xf0) {
              (parser->buffer).pointer = pbVar8 + 1;
              *local_c8[0] = *pbVar8;
              pbVar8 = (parser->buffer).pointer;
              local_c8[0] = local_c8[0] + 1;
              goto LAB_00111d30;
            }
          }
          else {
LAB_00111d78:
            (parser->buffer).pointer = pbVar8 + 1;
            *local_c8[0] = *pbVar8;
            local_c8[0] = local_c8[0] + 1;
          }
          (parser->mark).index = (parser->mark).index + 1;
          psVar1 = &(parser->mark).column;
          *psVar1 = *psVar1 + 1;
          psVar1 = &parser->unread;
          *psVar1 = *psVar1 - 1;
          if ((*psVar1 == 0) && (iVar5 = yaml_parser_update_buffer(parser,1), iVar5 == 0))
          goto LAB_00111dcb;
          iVar4 = iVar4 + -1;
        }
        if (iVar4 != 0) {
          uVar6 = (uint)bVar2;
          if (bVar2 < 0x3f) {
            if (uVar6 < 0x3b) {
              uVar9 = 0x400102100002601;
LAB_00111e10:
              if ((uVar9 >> ((ulong)uVar6 & 0x3f) & 1) != 0) {
LAB_00111e3b:
                local_88.data.tag.suffix = (yaml_char_t *)0x0;
                local_88.data._16_8_ = 0;
                if (local_ac == YAML_ANCHOR_TOKEN) {
                  local_88.type = YAML_ANCHOR_TOKEN;
                  local_88._4_4_ = 0;
                }
                else {
                  local_88.type = YAML_ALIAS_TOKEN;
                  local_88._4_4_ = 0;
                }
                local_88.start_mark.column = local_98;
                local_88.start_mark.index = CONCAT44(uStack_a4,local_a8);
                local_88.start_mark.line = CONCAT44(uStack_9c,uStack_a0);
                local_88.end_mark.column = local_b8->column;
                local_88.end_mark.index = local_b8->index;
                local_88.end_mark.line = local_b8->line;
                local_88.data.tag.handle = local_d8;
                tail = &(parser->tokens).tail;
                if (((parser->tokens).tail == (parser->tokens).end) &&
                   (iVar4 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,tail,
                                              &(parser->tokens).end), iVar4 == 0)) {
                  parser->error = YAML_MEMORY_ERROR;
                  yaml_token_delete(&local_88);
                  return 0;
                }
                pyVar14 = *tail;
                *tail = pyVar14 + 1;
                pyVar13 = &local_88;
                for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
                  uVar3 = *(undefined4 *)&pyVar13->field_0x4;
                  pyVar14->type = pyVar13->type;
                  *(undefined4 *)&pyVar14->field_0x4 = uVar3;
                  pyVar13 = (yaml_token_t *)((long)pyVar13 + ((ulong)bVar15 * -2 + 1) * 8);
                  pyVar14 = (yaml_token_t *)((long)pyVar14 + (ulong)bVar15 * -0x10 + 8);
                }
                return 1;
              }
            }
          }
          else {
            uVar11 = bVar2 - 0x3f;
            uVar9 = (ulong)uVar11;
            if ((uVar11 < 0x3f) && ((0x4000000240000003U >> (uVar9 & 0x3f) & 1) != 0))
            goto LAB_00111e3b;
            if (bVar2 == 0xe2) {
LAB_00111f40:
              if (((pbVar8[1] == 0x80) && (pbVar8[2] == 0xa8)) ||
                 ((uVar11 < 0x3f && ((0x4000000240000003U >> (uVar9 & 0x3f) & 1) != 0))))
              goto LAB_00111e3b;
              if (uVar6 < 0x3b) {
                uVar9 = 0x400102000000001;
                goto LAB_00111e10;
              }
            }
            else if (bVar2 == 0xc2) {
              if (((pbVar8[1] == 0x85) ||
                  ((uVar11 < 0x3f && ((0x4000000240000003U >> (uVar9 & 0x3f) & 1) != 0)))) ||
                 ((uVar6 < 0x3b && ((0x400102000000001U >> ((ulong)uVar6 & 0x3f) & 1) != 0))))
              goto LAB_00111e3b;
              if (uVar6 == 0xe2) goto LAB_00111f40;
            }
          }
        }
        pcVar10 = "while scanning an alias";
        if (local_ac == YAML_ANCHOR_TOKEN) {
          pcVar10 = "while scanning an anchor";
        }
        parser->error = YAML_SCANNER_ERROR;
        parser->context = pcVar10;
        (parser->context_mark).index = CONCAT44(uStack_a4,local_a8);
        (parser->context_mark).line = CONCAT44(uStack_9c,uStack_a0);
        (parser->context_mark).column = local_98;
        parser->problem = "did not find expected alphabetic or numeric character";
        sVar7 = local_b8->line;
        (parser->problem_mark).index = local_b8->index;
        (parser->problem_mark).line = sVar7;
        (parser->problem_mark).column = local_b8->column;
      }
    }
LAB_00111dcb:
    yaml_free(local_d8);
  }
  return 0;
}

Assistant:

static int
yaml_parser_fetch_anchor(yaml_parser_t *parser, yaml_token_type_t type)
{
    yaml_token_t token;

    /* An anchor or an alias could be a simple key. */

    if (!yaml_parser_save_simple_key(parser))
        return 0;

    /* A simple key cannot follow an anchor or an alias. */

    parser->simple_key_allowed = 0;

    /* Create the ALIAS or ANCHOR token and append it to the queue. */

    if (!yaml_parser_scan_anchor(parser, &token, type))
        return 0;

    if (!ENQUEUE(parser, parser->tokens, token)) {
        yaml_token_delete(&token);
        return 0;
    }
    return 1;
}